

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<8,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  size_t k;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  byte bVar29;
  byte bVar30;
  long lVar31;
  ulong *puVar32;
  ulong uVar33;
  long lVar34;
  byte bVar35;
  NodeRef root;
  byte bVar36;
  byte bVar37;
  undefined4 uVar38;
  uint *puVar39;
  undefined1 (*pauVar40) [16];
  bool bVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar83;
  float fVar84;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar85;
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  vfloat_impl<4> vVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  vfloat_impl<4> vVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar134;
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [64];
  float fVar141;
  float fVar142;
  float fVar145;
  float fVar147;
  undefined1 auVar143 [16];
  float fVar146;
  float fVar148;
  undefined1 auVar144 [16];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  Precalculations pre;
  vfloat<8> lower_y;
  vfloat<8> lower_z;
  vfloat<8> upper_x;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<8> upper_z;
  TravRayK<4,_true> tray;
  vfloat<8> upper_y;
  vfloat<8> lower_x;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  uint local_39ec;
  Precalculations local_39b9;
  uint local_39b8;
  uint local_39b4;
  undefined1 local_39b0 [16];
  RTCFilterFunctionNArguments local_39a0;
  RayK<4> *local_3968;
  ulong local_3960;
  undefined4 local_3958;
  undefined4 local_3954;
  ulong *local_3950;
  ulong local_3948;
  undefined1 local_3940 [32];
  undefined1 local_3910 [16];
  undefined1 local_3900 [48];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_38d0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_38c0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_38b0;
  undefined1 local_38a0 [16];
  uint local_3890;
  uint uStack_388c;
  uint uStack_3888;
  uint uStack_3884;
  uint uStack_3880;
  uint uStack_387c;
  uint uStack_3878;
  uint uStack_3874;
  undefined1 local_3860 [16];
  undefined1 local_3850 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3840;
  BVH *local_3828;
  Intersectors *local_3820;
  long local_3818;
  long local_3810;
  long local_3808;
  undefined1 local_3800 [32];
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 local_37d0;
  undefined8 uStack_37c8;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_37c0;
  undefined1 local_3790 [16];
  undefined1 local_3780 [16];
  undefined1 local_3770 [16];
  undefined1 local_3760 [8];
  float fStack_3758;
  float fStack_3754;
  undefined1 local_3750 [8];
  float fStack_3748;
  float fStack_3744;
  undefined1 local_3740 [16];
  int local_3730;
  int iStack_372c;
  int iStack_3728;
  int iStack_3724;
  uint local_3720;
  uint uStack_371c;
  uint uStack_3718;
  uint uStack_3714;
  uint local_3710;
  uint uStack_370c;
  uint uStack_3708;
  uint uStack_3704;
  undefined1 local_3700 [16];
  undefined1 local_36f0 [16];
  undefined1 local_36e0 [2] [32];
  undefined1 local_36a0 [16];
  undefined1 local_3690 [16];
  undefined1 local_3680 [16];
  undefined1 local_3670 [16];
  undefined1 local_3660 [16];
  undefined1 local_3650 [16];
  undefined1 local_3640 [16];
  undefined1 local_3630 [16];
  undefined1 local_3620 [16];
  undefined1 local_3610 [16];
  undefined1 local_3600 [32];
  undefined1 local_35e0 [16];
  undefined1 local_35d0 [16];
  undefined1 local_35c0 [16];
  undefined1 local_35b0 [16];
  undefined1 local_35a0 [16];
  undefined1 local_3590 [16];
  undefined1 local_3580 [16];
  undefined1 local_3570 [16];
  undefined1 local_3560 [16];
  undefined1 local_3550 [16];
  undefined1 local_3540 [16];
  undefined1 local_3530 [16];
  undefined1 local_3520 [16];
  undefined1 local_3510 [16];
  undefined8 local_3500;
  size_t local_34f8;
  ulong local_34f0 [560];
  undefined1 local_2370 [16];
  undefined1 local_2360 [16];
  undefined1 local_2350 [8992];
  
  local_34f8 = (((BVH *)This->ptr)->root).ptr;
  if (local_34f8 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar43 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      auVar47 = ZEXT816(0) << 0x40;
      uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar47,5);
      uVar42 = vpcmpeqd_avx512vl(auVar43,(undefined1  [16])valid_i->field_0);
      uVar42 = ((byte)uVar10 & 0xf) & uVar42;
      bVar35 = (byte)uVar42;
      if (bVar35 != 0) {
        local_37c0._0_8_ = *(undefined8 *)ray;
        local_37c0._8_8_ = *(undefined8 *)(ray + 8);
        local_37c0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_37c0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_37c0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_37c0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_3790 = *(undefined1 (*) [16])(ray + 0x40);
        local_3780 = *(undefined1 (*) [16])(ray + 0x50);
        local_3770 = *(undefined1 (*) [16])(ray + 0x60);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar150 = ZEXT1664(auVar43);
        auVar44 = vandps_avx512vl(local_3790,auVar43);
        auVar62._8_4_ = 0x219392ef;
        auVar62._0_8_ = 0x219392ef219392ef;
        auVar62._12_4_ = 0x219392ef;
        uVar33 = vcmpps_avx512vl(auVar44,auVar62,1);
        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar151 = ZEXT1664(auVar44);
        auVar45 = vdivps_avx512vl(auVar44,local_3790);
        auVar46 = vandps_avx512vl(local_3780,auVar43);
        uVar28 = vcmpps_avx512vl(auVar46,auVar62,1);
        auVar46 = vdivps_avx512vl(auVar44,local_3780);
        auVar43 = vandps_avx512vl(local_3770,auVar43);
        uVar25 = vcmpps_avx512vl(auVar43,auVar62,1);
        auVar43 = vdivps_avx512vl(auVar44,local_3770);
        bVar41 = (bool)((byte)uVar33 & 1);
        local_3760._0_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar45._0_4_;
        bVar41 = (bool)((byte)(uVar33 >> 1) & 1);
        local_3760._4_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar45._4_4_;
        bVar41 = (bool)((byte)(uVar33 >> 2) & 1);
        fStack_3758 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar45._8_4_);
        bVar41 = (bool)((byte)(uVar33 >> 3) & 1);
        fStack_3754 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar45._12_4_);
        bVar41 = (bool)((byte)uVar28 & 1);
        local_3750._0_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._0_4_;
        bVar41 = (bool)((byte)(uVar28 >> 1) & 1);
        local_3750._4_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._4_4_;
        bVar41 = (bool)((byte)(uVar28 >> 2) & 1);
        fStack_3748 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._8_4_);
        bVar41 = (bool)((byte)(uVar28 >> 3) & 1);
        fStack_3744 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._12_4_);
        bVar41 = (bool)((byte)uVar25 & 1);
        local_3740._0_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._0_4_;
        bVar41 = (bool)((byte)(uVar25 >> 1) & 1);
        local_3740._4_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._4_4_;
        bVar41 = (bool)((byte)(uVar25 >> 2) & 1);
        local_3740._8_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._8_4_;
        bVar41 = (bool)((byte)(uVar25 >> 3) & 1);
        local_3740._12_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._12_4_;
        uVar33 = vcmpps_avx512vl(_local_3760,auVar47,1);
        auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_3730 = (uint)((byte)uVar33 & 1) * auVar43._0_4_;
        iStack_372c = (uint)((byte)(uVar33 >> 1) & 1) * auVar43._4_4_;
        iStack_3728 = (uint)((byte)(uVar33 >> 2) & 1) * auVar43._8_4_;
        iStack_3724 = (uint)((byte)(uVar33 >> 3) & 1) * auVar43._12_4_;
        local_3958 = (int)uVar42;
        uVar33 = vcmpps_avx512vl(_local_3750,auVar47,5);
        auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar41 = (bool)((byte)uVar33 & 1);
        bVar7 = (bool)((byte)(uVar33 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar33 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar33 >> 3) & 1);
        local_3720 = (uint)bVar41 * auVar43._0_4_ | (uint)!bVar41 * 0x60;
        uStack_371c = (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * 0x60;
        uStack_3718 = (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * 0x60;
        uStack_3714 = (uint)bVar9 * auVar43._12_4_ | (uint)!bVar9 * 0x60;
        uVar33 = vcmpps_avx512vl(local_3740,auVar47,5);
        auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar41 = (bool)((byte)uVar33 & 1);
        bVar7 = (bool)((byte)(uVar33 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar33 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar33 >> 3) & 1);
        local_3710 = (uint)bVar41 * auVar43._0_4_ | (uint)!bVar41 * 0xa0;
        uStack_370c = (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * 0xa0;
        uStack_3708 = (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * 0xa0;
        uStack_3704 = (uint)bVar9 * auVar43._12_4_ | (uint)!bVar9 * 0xa0;
        local_2370 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar152 = ZEXT1664(local_2370);
        auVar43 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar47);
        local_3700._0_4_ =
             (uint)(bVar35 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar35 & 1) * local_2370._0_4_;
        bVar41 = (bool)((byte)(uVar42 >> 1) & 1);
        local_3700._4_4_ = (uint)bVar41 * auVar43._4_4_ | (uint)!bVar41 * local_2370._4_4_;
        bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
        local_3700._8_4_ = (uint)bVar41 * auVar43._8_4_ | (uint)!bVar41 * local_2370._8_4_;
        bVar41 = SUB81(uVar42 >> 3,0);
        local_3700._12_4_ = (uint)bVar41 * auVar43._12_4_ | (uint)!bVar41 * local_2370._12_4_;
        auVar43 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar47);
        local_36f0._0_4_ =
             (uint)(bVar35 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar35 & 1) * -0x800000;
        bVar41 = (bool)((byte)(uVar42 >> 1) & 1);
        local_36f0._4_4_ = (uint)bVar41 * auVar43._4_4_ | (uint)!bVar41 * -0x800000;
        bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
        local_36f0._8_4_ = (uint)bVar41 * auVar43._8_4_ | (uint)!bVar41 * -0x800000;
        bVar41 = SUB81(uVar42 >> 3,0);
        local_36f0._12_4_ = (uint)bVar41 * auVar43._12_4_ | (uint)!bVar41 * -0x800000;
        local_3820 = This;
        local_3828 = (BVH *)This->ptr;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar33 = 3;
        }
        else {
          uVar33 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
        }
        local_3968 = ray + 0x80;
        local_39ec = (ushort)uVar42 ^ 0xf;
        puVar32 = local_34f0;
        local_3500 = 0xfffffffffffffff8;
        pauVar40 = (undefined1 (*) [16])local_2350;
        local_2360 = local_3700;
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar153 = ZEXT1664(auVar43);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar154 = ZEXT1664(auVar43);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        auVar155 = ZEXT1664(auVar43);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar149 = ZEXT1664(auVar43);
        local_3960 = uVar33;
LAB_01d894ae:
        do {
          do {
            root.ptr = puVar32[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01d8ad95;
            puVar32 = puVar32 + -1;
            auVar43 = pauVar40[-1];
            auVar140 = ZEXT1664(auVar43);
            pauVar40 = pauVar40 + -1;
            uVar42 = vcmpps_avx512vl(auVar43,local_36f0,1);
          } while ((char)uVar42 == '\0');
          uVar38 = (undefined4)uVar42;
          if (uVar33 < (uint)POPCOUNT(uVar38)) {
LAB_01d894f6:
            do {
              uVar42 = 8;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01d8ad95;
                uVar10 = vcmpps_avx512vl(auVar140._0_16_,local_36f0,9);
                if ((char)uVar10 != '\0') {
                  local_3818 = (ulong)((uint)root.ptr & 0xf) - 8;
                  uVar42 = root.ptr & 0xfffffffffffffff0;
                  bVar35 = ~(byte)local_39ec & 0xf;
                  local_3950 = puVar32;
                  lVar27 = 0;
                  while (lVar27 != local_3818) {
                    local_3810 = lVar27;
                    lVar27 = lVar27 * 0x90;
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = *(ulong *)(uVar42 + 0x40 + lVar27);
                    auVar55._8_8_ = 0;
                    auVar55._0_8_ = *(ulong *)(uVar42 + 0x48 + lVar27);
                    uVar28 = vpcmpub_avx512vl(auVar43,auVar55,2);
                    if ((char)uVar28 != '\0') {
                      lVar27 = lVar27 + uVar42;
                      uVar28 = uVar28 & 0xff;
                      local_3808 = lVar27;
                      do {
                        auVar56._8_8_ = 0;
                        auVar56._0_8_ = *(ulong *)(lVar27 + 0x40);
                        auVar82 = vpmovzxbd_avx2(auVar56);
                        auVar82 = vcvtdq2ps_avx(auVar82);
                        uVar38 = *(undefined4 *)(lVar27 + 0x7c);
                        auVar89._4_4_ = uVar38;
                        auVar89._0_4_ = uVar38;
                        auVar89._8_4_ = uVar38;
                        auVar89._12_4_ = uVar38;
                        auVar89._16_4_ = uVar38;
                        auVar89._20_4_ = uVar38;
                        auVar89._24_4_ = uVar38;
                        auVar89._28_4_ = uVar38;
                        uVar38 = *(undefined4 *)(lVar27 + 0x70);
                        auVar96._4_4_ = uVar38;
                        auVar96._0_4_ = uVar38;
                        auVar96._8_4_ = uVar38;
                        auVar96._12_4_ = uVar38;
                        auVar96._16_4_ = uVar38;
                        auVar96._20_4_ = uVar38;
                        auVar96._24_4_ = uVar38;
                        auVar96._28_4_ = uVar38;
                        auVar43 = vfmadd213ps_fma(auVar82,auVar89,auVar96);
                        local_3600 = ZEXT1632(auVar43);
                        auVar57._8_8_ = 0;
                        auVar57._0_8_ = *(ulong *)(lVar27 + 0x48);
                        auVar82 = vpmovzxbd_avx2(auVar57);
                        auVar82 = vcvtdq2ps_avx(auVar82);
                        auVar43 = vfmadd213ps_fma(auVar82,auVar89,auVar96);
                        local_3900._0_32_ = ZEXT1632(auVar43);
                        auVar59._8_8_ = 0;
                        auVar59._0_8_ = *(ulong *)(lVar27 + 0x50);
                        auVar82 = vpmovzxbd_avx2(auVar59);
                        uVar38 = *(undefined4 *)(lVar27 + 0x80);
                        auVar90._4_4_ = uVar38;
                        auVar90._0_4_ = uVar38;
                        auVar90._8_4_ = uVar38;
                        auVar90._12_4_ = uVar38;
                        auVar90._16_4_ = uVar38;
                        auVar90._20_4_ = uVar38;
                        auVar90._24_4_ = uVar38;
                        auVar90._28_4_ = uVar38;
                        auVar82 = vcvtdq2ps_avx(auVar82);
                        uVar38 = *(undefined4 *)(lVar27 + 0x74);
                        auVar97._4_4_ = uVar38;
                        auVar97._0_4_ = uVar38;
                        auVar97._8_4_ = uVar38;
                        auVar97._12_4_ = uVar38;
                        auVar97._16_4_ = uVar38;
                        auVar97._20_4_ = uVar38;
                        auVar97._24_4_ = uVar38;
                        auVar97._28_4_ = uVar38;
                        auVar43 = vfmadd213ps_fma(auVar82,auVar90,auVar97);
                        auVar82 = ZEXT1632(auVar43);
                        local_39a0.valid = (int *)auVar82._0_8_;
                        local_39a0.geometryUserPtr = (void *)auVar82._8_8_;
                        local_39a0.context = (RTCRayQueryContext *)auVar82._16_8_;
                        local_39a0.ray = (RTCRayN *)auVar82._24_8_;
                        auVar60._8_8_ = 0;
                        auVar60._0_8_ = *(ulong *)(lVar27 + 0x58);
                        auVar82 = vpmovzxbd_avx2(auVar60);
                        auVar82 = vcvtdq2ps_avx(auVar82);
                        auVar43 = vfmadd213ps_fma(auVar82,auVar90,auVar97);
                        local_36e0[0] = ZEXT1632(auVar43);
                        auVar63._8_8_ = 0;
                        auVar63._0_8_ = *(ulong *)(lVar27 + 0x60);
                        auVar82 = vpmovzxbd_avx2(auVar63);
                        uVar38 = *(undefined4 *)(lVar27 + 0x84);
                        auVar91._4_4_ = uVar38;
                        auVar91._0_4_ = uVar38;
                        auVar91._8_4_ = uVar38;
                        auVar91._12_4_ = uVar38;
                        auVar91._16_4_ = uVar38;
                        auVar91._20_4_ = uVar38;
                        auVar91._24_4_ = uVar38;
                        auVar91._28_4_ = uVar38;
                        uVar38 = *(undefined4 *)(lVar27 + 0x78);
                        auVar98._4_4_ = uVar38;
                        auVar98._0_4_ = uVar38;
                        auVar98._8_4_ = uVar38;
                        auVar98._12_4_ = uVar38;
                        auVar98._16_4_ = uVar38;
                        auVar98._20_4_ = uVar38;
                        auVar98._24_4_ = uVar38;
                        auVar98._28_4_ = uVar38;
                        auVar82 = vcvtdq2ps_avx(auVar82);
                        auVar43 = vfmadd213ps_fma(auVar82,auVar91,auVar98);
                        local_3940 = ZEXT1632(auVar43);
                        auVar66._8_8_ = 0;
                        auVar66._0_8_ = *(ulong *)(lVar27 + 0x68);
                        auVar82 = vpmovzxbd_avx2(auVar66);
                        lVar13 = 0;
                        for (uVar25 = uVar28; (uVar25 & 1) == 0;
                            uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                          lVar13 = lVar13 + 1;
                        }
                        auVar82 = vcvtdq2ps_avx(auVar82);
                        auVar43 = vfmadd213ps_fma(auVar82,auVar91,auVar98);
                        local_3800 = ZEXT1632(auVar43);
                        uVar25 = (ulong)(uint)((int)lVar13 * 4);
                        uVar38 = *(undefined4 *)(local_3600 + uVar25);
                        auVar76._4_4_ = uVar38;
                        auVar76._0_4_ = uVar38;
                        auVar76._8_4_ = uVar38;
                        auVar76._12_4_ = uVar38;
                        auVar67._8_8_ = local_37c0._8_8_;
                        auVar67._0_8_ = local_37c0._0_8_;
                        auVar20._8_8_ = local_37c0._24_8_;
                        auVar20._0_8_ = local_37c0._16_8_;
                        auVar21._8_8_ = local_37c0._40_8_;
                        auVar21._0_8_ = local_37c0._32_8_;
                        auVar43 = vsubps_avx(auVar76,auVar67);
                        auVar77._0_4_ = (float)local_3760._0_4_ * auVar43._0_4_;
                        auVar77._4_4_ = (float)local_3760._4_4_ * auVar43._4_4_;
                        auVar77._8_4_ = fStack_3758 * auVar43._8_4_;
                        auVar77._12_4_ = fStack_3754 * auVar43._12_4_;
                        uVar38 = *(undefined4 *)((long)&local_39a0.valid + uVar25);
                        auVar109._4_4_ = uVar38;
                        auVar109._0_4_ = uVar38;
                        auVar109._8_4_ = uVar38;
                        auVar109._12_4_ = uVar38;
                        auVar43 = vsubps_avx(auVar109,auVar20);
                        auVar110._0_4_ = (float)local_3750._0_4_ * auVar43._0_4_;
                        auVar110._4_4_ = (float)local_3750._4_4_ * auVar43._4_4_;
                        auVar110._8_4_ = fStack_3748 * auVar43._8_4_;
                        auVar110._12_4_ = fStack_3744 * auVar43._12_4_;
                        uVar38 = *(undefined4 *)(local_3940 + uVar25);
                        auVar117._4_4_ = uVar38;
                        auVar117._0_4_ = uVar38;
                        auVar117._8_4_ = uVar38;
                        auVar117._12_4_ = uVar38;
                        auVar43 = vsubps_avx(auVar117,auVar21);
                        auVar118._0_4_ = local_3740._0_4_ * auVar43._0_4_;
                        auVar118._4_4_ = local_3740._4_4_ * auVar43._4_4_;
                        auVar118._8_4_ = local_3740._8_4_ * auVar43._8_4_;
                        auVar118._12_4_ = local_3740._12_4_ * auVar43._12_4_;
                        uVar38 = *(undefined4 *)(local_3900 + uVar25);
                        auVar128._4_4_ = uVar38;
                        auVar128._0_4_ = uVar38;
                        auVar128._8_4_ = uVar38;
                        auVar128._12_4_ = uVar38;
                        auVar43 = vsubps_avx(auVar128,auVar67);
                        auVar86._0_4_ = (float)local_3760._0_4_ * auVar43._0_4_;
                        auVar86._4_4_ = (float)local_3760._4_4_ * auVar43._4_4_;
                        auVar86._8_4_ = fStack_3758 * auVar43._8_4_;
                        auVar86._12_4_ = fStack_3754 * auVar43._12_4_;
                        uVar38 = *(undefined4 *)(local_36e0[0] + uVar25);
                        auVar106._4_4_ = uVar38;
                        auVar106._0_4_ = uVar38;
                        auVar106._8_4_ = uVar38;
                        auVar106._12_4_ = uVar38;
                        auVar43 = vsubps_avx(auVar106,auVar20);
                        auVar92._0_4_ = (float)local_3750._0_4_ * auVar43._0_4_;
                        auVar92._4_4_ = (float)local_3750._4_4_ * auVar43._4_4_;
                        auVar92._8_4_ = fStack_3748 * auVar43._8_4_;
                        auVar92._12_4_ = fStack_3744 * auVar43._12_4_;
                        uVar38 = *(undefined4 *)(local_3800 + uVar25);
                        auVar107._4_4_ = uVar38;
                        auVar107._0_4_ = uVar38;
                        auVar107._8_4_ = uVar38;
                        auVar107._12_4_ = uVar38;
                        auVar43 = vsubps_avx(auVar107,auVar21);
                        auVar99._0_4_ = local_3740._0_4_ * auVar43._0_4_;
                        auVar99._4_4_ = local_3740._4_4_ * auVar43._4_4_;
                        auVar99._8_4_ = local_3740._8_4_ * auVar43._8_4_;
                        auVar99._12_4_ = local_3740._12_4_ * auVar43._12_4_;
                        auVar43 = vminps_avx(auVar77,auVar86);
                        auVar47 = vminps_avx(auVar110,auVar92);
                        auVar43 = vmaxps_avx(auVar43,auVar47);
                        auVar47 = vminps_avx(auVar118,auVar99);
                        auVar43 = vmaxps_avx(auVar43,auVar47);
                        auVar44 = vmulps_avx512vl(auVar43,auVar153._0_16_);
                        auVar43 = vmaxps_avx(auVar77,auVar86);
                        auVar47 = vmaxps_avx(auVar110,auVar92);
                        auVar47 = vminps_avx(auVar43,auVar47);
                        auVar43 = vmaxps_avx(auVar118,auVar99);
                        auVar43 = vminps_avx(auVar47,auVar43);
                        auVar47 = vmulps_avx512vl(auVar43,auVar154._0_16_);
                        auVar43 = vmaxps_avx(auVar44,local_3700);
                        auVar47 = vminps_avx(auVar47,local_36f0);
                        uVar10 = vcmpps_avx512vl(auVar43,auVar47,2);
                        if ((bVar35 & (byte)uVar10) == 0) {
                          bVar41 = false;
                        }
                        else {
                          local_3948 = uVar28;
                          uVar2 = *(ushort *)(lVar27 + lVar13 * 8);
                          uVar3 = *(ushort *)(lVar27 + 2 + lVar13 * 8);
                          pGVar4 = (context->scene->geometries).items[*(uint *)(lVar27 + 0x88)].ptr;
                          lVar5 = *(long *)&pGVar4->field_0x58;
                          lVar26 = (ulong)*(uint *)(lVar27 + 4 + lVar13 * 8) *
                                   pGVar4[1].super_RefCount.refCounter.
                                   super___atomic_base<unsigned_long>._M_i;
                          lVar13 = *(long *)&pGVar4[1].time_range.upper;
                          local_39b4 = uVar2 & 0x7fff;
                          local_39b8 = uVar3 & 0x7fff;
                          uVar24 = *(uint *)(lVar5 + 4 + lVar26);
                          uVar33 = (ulong)uVar24;
                          uVar25 = (ulong)(uVar24 * local_39b8 +
                                          *(int *)(lVar5 + lVar26) + local_39b4);
                          p_Var6 = pGVar4[1].intersectionFilterN;
                          local_3600._16_16_ =
                               *(undefined1 (*) [16])(lVar13 + (uVar25 + 1) * (long)p_Var6);
                          lVar27 = uVar25 + uVar33;
                          local_35d0 = *(undefined1 (*) [16])(lVar13 + lVar27 * (long)p_Var6);
                          lVar31 = uVar25 + uVar33 + 1;
                          local_35e0 = *(undefined1 (*) [16])(lVar13 + lVar31 * (long)p_Var6);
                          local_3690 = vpbroadcastd_avx512vl();
                          uVar28 = (ulong)(-1 < (short)uVar2);
                          lVar34 = uVar28 + lVar31;
                          local_35a0 = *(undefined1 (*) [16])(lVar13 + lVar34 * (long)p_Var6);
                          if ((short)uVar3 < 0) {
                            uVar33 = 0;
                          }
                          local_3560 = *(undefined1 (*) [16])
                                        (lVar13 + (lVar31 + uVar33) * (long)p_Var6);
                          local_3600._0_16_ = *(undefined1 (*) [16])(lVar13 + (long)p_Var6 * uVar25)
                          ;
                          local_35c0 = local_3600._16_16_;
                          local_35b0 = *(undefined1 (*) [16])
                                        (lVar13 + (uVar25 + uVar28 + 1) * (long)p_Var6);
                          local_3590 = local_35e0;
                          local_3580 = local_35d0;
                          local_3570 = local_35e0;
                          local_3550 = *(undefined1 (*) [16])
                                        (lVar13 + (lVar27 + uVar33) * (long)p_Var6);
                          local_3540 = local_35e0;
                          local_3530 = local_35a0;
                          local_3520 = *(undefined1 (*) [16])
                                        (lVar13 + (uVar33 + lVar34) * (long)p_Var6);
                          local_3510 = local_3560;
                          local_36a0 = vpbroadcastd_avx512vl();
                          puVar39 = (uint *)(local_35d0 + 8);
                          lVar27 = 0;
                          bVar30 = bVar35;
                          do {
                            if (lVar27 == 4) goto LAB_01d8abf0;
                            uVar24 = puVar39[-0xe];
                            auVar78._4_4_ = uVar24;
                            auVar78._0_4_ = uVar24;
                            auVar78._8_4_ = uVar24;
                            auVar78._12_4_ = uVar24;
                            uVar24 = puVar39[-0xd];
                            auVar87._4_4_ = uVar24;
                            auVar87._0_4_ = uVar24;
                            auVar87._8_4_ = uVar24;
                            auVar87._12_4_ = uVar24;
                            uVar24 = puVar39[-0xc];
                            auVar93._4_4_ = uVar24;
                            auVar93._0_4_ = uVar24;
                            auVar93._8_4_ = uVar24;
                            auVar93._12_4_ = uVar24;
                            uVar24 = puVar39[-10];
                            local_3860._4_4_ = uVar24;
                            local_3860._0_4_ = uVar24;
                            local_3860._8_4_ = uVar24;
                            local_3860._12_4_ = uVar24;
                            uVar24 = puVar39[-9];
                            local_3610._4_4_ = uVar24;
                            local_3610._0_4_ = uVar24;
                            local_3610._8_4_ = uVar24;
                            local_3610._12_4_ = uVar24;
                            uVar24 = puVar39[-8];
                            local_3620._4_4_ = uVar24;
                            local_3620._0_4_ = uVar24;
                            local_3620._8_4_ = uVar24;
                            local_3620._12_4_ = uVar24;
                            uVar24 = puVar39[-2];
                            local_3630._4_4_ = uVar24;
                            local_3630._0_4_ = uVar24;
                            local_3630._8_4_ = uVar24;
                            local_3630._12_4_ = uVar24;
                            local_3640 = vbroadcastss_avx512vl(ZEXT416(puVar39[-1]));
                            local_3650 = vbroadcastss_avx512vl(ZEXT416(*puVar39));
                            local_37d0 = local_36a0._0_8_;
                            uStack_37c8 = local_36a0._8_8_;
                            local_37e0 = local_3690._0_8_;
                            uStack_37d8 = local_3690._8_8_;
                            auVar43 = *(undefined1 (*) [16])ray;
                            auVar47 = *(undefined1 (*) [16])(ray + 0x10);
                            auVar44 = *(undefined1 (*) [16])(ray + 0x20);
                            auVar45 = *(undefined1 (*) [16])(ray + 0x40);
                            auVar46 = *(undefined1 (*) [16])(ray + 0x50);
                            auVar62 = *(undefined1 (*) [16])(ray + 0x60);
                            auVar75 = vsubps_avx(auVar78,auVar43);
                            auVar70 = vsubps_avx(auVar87,auVar47);
                            auVar71 = vsubps_avx(auVar93,auVar44);
                            auVar61 = vsubps_avx(local_3860,auVar43);
                            auVar48 = vsubps_avx512vl(local_3610,auVar47);
                            auVar49 = vsubps_avx512vl(local_3620,auVar44);
                            auVar50 = vsubps_avx512vl(local_3630,auVar43);
                            auVar51 = vsubps_avx512vl(local_3640,auVar47);
                            auVar52 = vsubps_avx512vl(local_3650,auVar44);
                            auVar53 = vsubps_avx512vl(auVar50,auVar75);
                            auVar54 = vsubps_avx512vl(auVar51,auVar70);
                            auVar43 = vsubps_avx(auVar52,auVar71);
                            auVar55 = vsubps_avx512vl(auVar75,auVar61);
                            auVar56 = vsubps_avx512vl(auVar70,auVar48);
                            auVar57 = vsubps_avx512vl(auVar71,auVar49);
                            auVar58 = vaddps_avx512vl(auVar50,auVar75);
                            auVar59 = vaddps_avx512vl(auVar51,auVar70);
                            auVar94._0_4_ = auVar71._0_4_ + auVar52._0_4_;
                            auVar94._4_4_ = auVar71._4_4_ + auVar52._4_4_;
                            auVar94._8_4_ = auVar71._8_4_ + auVar52._8_4_;
                            auVar94._12_4_ = auVar71._12_4_ + auVar52._12_4_;
                            auVar100._0_4_ = auVar43._0_4_ * auVar59._0_4_;
                            auVar100._4_4_ = auVar43._4_4_ * auVar59._4_4_;
                            auVar100._8_4_ = auVar43._8_4_ * auVar59._8_4_;
                            auVar100._12_4_ = auVar43._12_4_ * auVar59._12_4_;
                            auVar44 = vfmsub231ps_fma(auVar100,auVar54,auVar94);
                            auVar95._0_4_ = auVar53._0_4_ * auVar94._0_4_;
                            auVar95._4_4_ = auVar53._4_4_ * auVar94._4_4_;
                            auVar95._8_4_ = auVar53._8_4_ * auVar94._8_4_;
                            auVar95._12_4_ = auVar53._12_4_ * auVar94._12_4_;
                            auVar47 = vfmsub231ps_fma(auVar95,auVar43,auVar58);
                            auVar79._0_4_ = auVar54._0_4_ * auVar58._0_4_;
                            auVar79._4_4_ = auVar54._4_4_ * auVar58._4_4_;
                            auVar79._8_4_ = auVar54._8_4_ * auVar58._8_4_;
                            auVar79._12_4_ = auVar54._12_4_ * auVar58._12_4_;
                            auVar58 = vfmsub231ps_fma(auVar79,auVar53,auVar59);
                            fVar141 = auVar62._0_4_;
                            auVar80._0_4_ = fVar141 * auVar58._0_4_;
                            fVar134 = auVar62._4_4_;
                            auVar80._4_4_ = fVar134 * auVar58._4_4_;
                            fVar145 = auVar62._8_4_;
                            auVar80._8_4_ = fVar145 * auVar58._8_4_;
                            fVar147 = auVar62._12_4_;
                            auVar80._12_4_ = fVar147 * auVar58._12_4_;
                            auVar47 = vfmadd231ps_fma(auVar80,auVar46,auVar47);
                            auVar47 = vfmadd231ps_fma(auVar47,auVar45,auVar44);
                            auVar88._0_4_ = auVar75._0_4_ + auVar61._0_4_;
                            auVar88._4_4_ = auVar75._4_4_ + auVar61._4_4_;
                            auVar88._8_4_ = auVar75._8_4_ + auVar61._8_4_;
                            auVar88._12_4_ = auVar75._12_4_ + auVar61._12_4_;
                            auVar44 = vaddps_avx512vl(auVar70,auVar48);
                            auVar58 = vaddps_avx512vl(auVar71,auVar49);
                            auVar59 = vmulps_avx512vl(auVar44,auVar57);
                            auVar59 = vfmsub231ps_avx512vl(auVar59,auVar56,auVar58);
                            auVar58 = vmulps_avx512vl(auVar58,auVar55);
                            auVar58 = vfmsub231ps_avx512vl(auVar58,auVar57,auVar88);
                            auVar60 = vmulps_avx512vl(auVar88,auVar56);
                            auVar44 = vfmsub231ps_avx512vl(auVar60,auVar55,auVar44);
                            auVar60 = vsubps_avx512vl(auVar61,auVar50);
                            auVar101._0_4_ = fVar141 * auVar44._0_4_;
                            auVar101._4_4_ = fVar134 * auVar44._4_4_;
                            auVar101._8_4_ = fVar145 * auVar44._8_4_;
                            auVar101._12_4_ = fVar147 * auVar44._12_4_;
                            auVar44 = vfmadd231ps_avx512vl(auVar101,auVar46,auVar58);
                            auVar58 = vsubps_avx512vl(auVar48,auVar51);
                            auVar44 = vfmadd231ps_fma(auVar44,auVar45,auVar59);
                            auVar59 = vsubps_avx512vl(auVar49,auVar52);
                            auVar50 = vaddps_avx512vl(auVar61,auVar50);
                            auVar48 = vaddps_avx512vl(auVar48,auVar51);
                            auVar61 = vaddps_avx512vl(auVar49,auVar52);
                            auVar49 = vmulps_avx512vl(auVar48,auVar59);
                            auVar49 = vfmsub231ps_avx512vl(auVar49,auVar58,auVar61);
                            auVar111._0_4_ = auVar61._0_4_ * auVar60._0_4_;
                            auVar111._4_4_ = auVar61._4_4_ * auVar60._4_4_;
                            auVar111._8_4_ = auVar61._8_4_ * auVar60._8_4_;
                            auVar111._12_4_ = auVar61._12_4_ * auVar60._12_4_;
                            auVar61 = vfmsub231ps_fma(auVar111,auVar59,auVar50);
                            auVar115._0_4_ = auVar50._0_4_ * auVar58._0_4_;
                            auVar115._4_4_ = auVar50._4_4_ * auVar58._4_4_;
                            auVar115._8_4_ = auVar50._8_4_ * auVar58._8_4_;
                            auVar115._12_4_ = auVar50._12_4_ * auVar58._12_4_;
                            auVar48 = vfmsub231ps_avx512vl(auVar115,auVar60,auVar48);
                            auVar62 = vmulps_avx512vl(auVar48,auVar62);
                            auVar62 = vfmadd231ps_avx512vl(auVar62,auVar46,auVar61);
                            auVar62 = vfmadd231ps_avx512vl(auVar62,auVar45,auVar49);
                            fVar142 = auVar44._0_4_;
                            fVar74 = auVar47._0_4_;
                            auVar112._0_4_ = fVar74 + fVar142;
                            fVar135 = auVar44._4_4_;
                            fVar83 = auVar47._4_4_;
                            auVar112._4_4_ = fVar83 + fVar135;
                            fVar146 = auVar44._8_4_;
                            fVar84 = auVar47._8_4_;
                            auVar112._8_4_ = fVar84 + fVar146;
                            fVar148 = auVar44._12_4_;
                            fVar85 = auVar47._12_4_;
                            auVar112._12_4_ = fVar85 + fVar148;
                            auVar61 = vaddps_avx512vl(auVar62,auVar112);
                            auVar52 = auVar150._0_16_;
                            auVar48 = vandps_avx512vl(auVar61,auVar52);
                            auVar49 = vmulps_avx512vl(auVar48,auVar155._0_16_);
                            auVar50 = vminps_avx512vl(auVar47,auVar44);
                            auVar50 = vminps_avx512vl(auVar50,auVar62);
                            auVar51 = vxorps_avx512vl(auVar49,auVar149._0_16_);
                            uVar10 = vcmpps_avx512vl(auVar50,auVar51,5);
                            auVar44 = vmaxps_avx512vl(auVar47,auVar44);
                            auVar44 = vmaxps_avx512vl(auVar44,auVar62);
                            local_3660 = vbroadcastss_avx512vl(ZEXT416(puVar39[-6]));
                            uVar11 = vcmpps_avx512vl(auVar44,auVar49,2);
                            local_3670 = vbroadcastss_avx512vl(ZEXT416(puVar39[-5]));
                            local_3680 = vbroadcastss_avx512vl(ZEXT416(puVar39[-4]));
                            bVar29 = ((byte)uVar10 | (byte)uVar11) & 0xf & bVar30;
                            uVar24 = (uint)lVar27;
                            bVar37 = bVar30;
                            if (bVar29 != 0) {
                              auVar44 = vmulps_avx512vl(auVar56,auVar43);
                              auVar62 = vmulps_avx512vl(auVar53,auVar57);
                              auVar49 = vmulps_avx512vl(auVar55,auVar54);
                              auVar50 = vmulps_avx512vl(auVar58,auVar57);
                              auVar51 = vmulps_avx512vl(auVar55,auVar59);
                              auVar63 = vmulps_avx512vl(auVar60,auVar56);
                              auVar54 = vfmsub213ps_avx512vl(auVar54,auVar57,auVar44);
                              auVar43 = vfmsub213ps_avx512vl(auVar43,auVar55,auVar62);
                              auVar53 = vfmsub213ps_avx512vl(auVar53,auVar56,auVar49);
                              auVar59 = vfmsub213ps_avx512vl(auVar59,auVar56,auVar50);
                              auVar57 = vfmsub213ps_avx512vl(auVar60,auVar57,auVar51);
                              auVar58 = vfmsub213ps_avx512vl(auVar58,auVar55,auVar63);
                              auVar44 = vandps_avx512vl(auVar44,auVar52);
                              auVar50 = vandps_avx512vl(auVar50,auVar52);
                              uVar33 = vcmpps_avx512vl(auVar44,auVar50,1);
                              auVar44 = vandps_avx512vl(auVar62,auVar52);
                              auVar62 = vandps_avx512vl(auVar51,auVar52);
                              uVar28 = vcmpps_avx512vl(auVar44,auVar62,1);
                              auVar44 = vandps_avx512vl(auVar49,auVar52);
                              auVar62 = vandps_avx512vl(auVar63,auVar52);
                              uVar25 = vcmpps_avx512vl(auVar44,auVar62,1);
                              bVar41 = (bool)((byte)uVar33 & 1);
                              auVar64._0_4_ =
                                   (uint)bVar41 * auVar54._0_4_ | (uint)!bVar41 * auVar59._0_4_;
                              bVar41 = (bool)((byte)(uVar33 >> 1) & 1);
                              auVar64._4_4_ =
                                   (uint)bVar41 * auVar54._4_4_ | (uint)!bVar41 * auVar59._4_4_;
                              bVar41 = (bool)((byte)(uVar33 >> 2) & 1);
                              auVar64._8_4_ =
                                   (uint)bVar41 * auVar54._8_4_ | (uint)!bVar41 * auVar59._8_4_;
                              bVar41 = (bool)((byte)(uVar33 >> 3) & 1);
                              auVar64._12_4_ =
                                   (uint)bVar41 * auVar54._12_4_ | (uint)!bVar41 * auVar59._12_4_;
                              bVar41 = (bool)((byte)uVar28 & 1);
                              auVar65._0_4_ =
                                   (uint)bVar41 * auVar43._0_4_ | (uint)!bVar41 * auVar57._0_4_;
                              bVar41 = (bool)((byte)(uVar28 >> 1) & 1);
                              auVar65._4_4_ =
                                   (uint)bVar41 * auVar43._4_4_ | (uint)!bVar41 * auVar57._4_4_;
                              bVar41 = (bool)((byte)(uVar28 >> 2) & 1);
                              auVar65._8_4_ =
                                   (uint)bVar41 * auVar43._8_4_ | (uint)!bVar41 * auVar57._8_4_;
                              bVar41 = (bool)((byte)(uVar28 >> 3) & 1);
                              auVar65._12_4_ =
                                   (uint)bVar41 * auVar43._12_4_ | (uint)!bVar41 * auVar57._12_4_;
                              bVar41 = (bool)((byte)uVar25 & 1);
                              local_3900._32_4_ =
                                   (float)((uint)bVar41 * auVar53._0_4_ |
                                          (uint)!bVar41 * auVar58._0_4_);
                              bVar41 = (bool)((byte)(uVar25 >> 1) & 1);
                              local_3900._36_4_ =
                                   (float)((uint)bVar41 * auVar53._4_4_ |
                                          (uint)!bVar41 * auVar58._4_4_);
                              bVar41 = (bool)((byte)(uVar25 >> 2) & 1);
                              local_3900._40_4_ =
                                   (float)((uint)bVar41 * auVar53._8_4_ |
                                          (uint)!bVar41 * auVar58._8_4_);
                              bVar41 = (bool)((byte)(uVar25 >> 3) & 1);
                              local_3900._44_4_ =
                                   (float)((uint)bVar41 * auVar53._12_4_ |
                                          (uint)!bVar41 * auVar58._12_4_);
                              auVar143._0_4_ = fVar141 * local_3900._32_4_;
                              auVar143._4_4_ = fVar134 * local_3900._36_4_;
                              auVar143._8_4_ = fVar145 * local_3900._40_4_;
                              auVar143._12_4_ = fVar147 * local_3900._44_4_;
                              auVar43 = vfmadd213ps_fma(auVar46,auVar65,auVar143);
                              auVar43 = vfmadd213ps_fma(auVar45,auVar64,auVar43);
                              auVar129._0_4_ = auVar43._0_4_ + auVar43._0_4_;
                              auVar129._4_4_ = auVar43._4_4_ + auVar43._4_4_;
                              auVar129._8_4_ = auVar43._8_4_ + auVar43._8_4_;
                              auVar129._12_4_ = auVar43._12_4_ + auVar43._12_4_;
                              auVar136._0_4_ = auVar71._0_4_ * local_3900._32_4_;
                              auVar136._4_4_ = auVar71._4_4_ * local_3900._36_4_;
                              auVar136._8_4_ = auVar71._8_4_ * local_3900._40_4_;
                              auVar136._12_4_ = auVar71._12_4_ * local_3900._44_4_;
                              auVar43 = vfmadd213ps_fma(auVar70,auVar65,auVar136);
                              auVar44 = vfmadd213ps_fma(auVar75,auVar64,auVar43);
                              auVar43 = vrcp14ps_avx512vl(auVar129);
                              auVar45 = vxorps_avx512vl(auVar129,auVar149._0_16_);
                              auVar62 = auVar151._0_16_;
                              auVar46 = vfnmadd213ps_avx512vl(auVar43,auVar129,auVar62);
                              auVar43 = vfmadd132ps_fma(auVar46,auVar43,auVar43);
                              vVar119.field_0._0_4_ =
                                   auVar43._0_4_ * (auVar44._0_4_ + auVar44._0_4_);
                              vVar119.field_0._4_4_ =
                                   auVar43._4_4_ * (auVar44._4_4_ + auVar44._4_4_);
                              vVar119.field_0._8_4_ =
                                   auVar43._8_4_ * (auVar44._8_4_ + auVar44._8_4_);
                              vVar119.field_0._12_4_ =
                                   auVar43._12_4_ * (auVar44._12_4_ + auVar44._12_4_);
                              uVar10 = vcmpps_avx512vl((undefined1  [16])vVar119.field_0,
                                                       *(undefined1 (*) [16])(ray + 0x80),2);
                              uVar11 = vcmpps_avx512vl((undefined1  [16])vVar119.field_0,
                                                       *(undefined1 (*) [16])(ray + 0x30),0xd);
                              uVar12 = vcmpps_avx512vl(auVar129,auVar45,4);
                              bVar29 = bVar29 & (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
                              if (bVar29 != 0) {
                                uVar28 = CONCAT44(0,*(uint *)((long)&local_37d0 + lVar27 * 4));
                                pGVar4 = (context->scene->geometries).items[uVar28].ptr;
                                local_39b0._0_8_ = pGVar4;
                                uVar1 = pGVar4->mask;
                                auVar121._4_4_ = uVar1;
                                auVar121._0_4_ = uVar1;
                                auVar121._8_4_ = uVar1;
                                auVar121._12_4_ = uVar1;
                                uVar10 = vptestmd_avx512vl(auVar121,*(undefined1 (*) [16])
                                                                     (ray + 0x90));
                                bVar36 = (byte)uVar10 & 0xf & bVar29;
                                uVar33 = (ulong)bVar36;
                                if (bVar36 != 0) {
                                  local_3910._0_8_ = uVar28;
                                  local_3954 = *(undefined4 *)((long)&local_37e0 + lVar27 * 4);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar43 = vcvtsi2ss_avx512f(auVar56,*(ushort *)
                                                                         (lVar5 + 8 + lVar26) - 1);
                                    auVar16._12_4_ = 0;
                                    auVar16._0_12_ = ZEXT812(0);
                                    auVar44 = vrcp14ss_avx512f(auVar16 << 0x20,
                                                               ZEXT416(auVar43._0_4_));
                                    auVar43 = vfnmadd213ss_fma(auVar43,auVar44,
                                                               SUB6416(ZEXT464(0x40000000),0));
                                    fVar141 = auVar44._0_4_ * auVar43._0_4_;
                                    auVar131._0_4_ =
                                         (float)(int)(*(ushort *)(lVar5 + 10 + lVar26) - 1);
                                    auVar131._4_12_ = auVar47._4_12_;
                                    fVar134 = (float)(int)((uVar24 & 1) + local_39b4);
                                    auVar138._0_4_ = fVar134 * auVar61._0_4_ + fVar74;
                                    auVar138._4_4_ = fVar134 * auVar61._4_4_ + fVar83;
                                    auVar138._8_4_ = fVar134 * auVar61._8_4_ + fVar84;
                                    auVar138._12_4_ = fVar134 * auVar61._12_4_ + fVar85;
                                    auVar124._4_4_ = fVar141;
                                    auVar124._0_4_ = fVar141;
                                    auVar124._8_4_ = fVar141;
                                    auVar124._12_4_ = fVar141;
                                    auVar47 = vmulps_avx512vl(auVar138,auVar124);
                                    bVar41 = (bool)(bVar29 >> 1 & 1);
                                    bVar8 = (bool)(bVar29 >> 2 & 1);
                                    auVar44 = vrcp14ss_avx512f(auVar16 << 0x20,
                                                               ZEXT416((uint)auVar131._0_4_));
                                    auVar43 = vfnmadd213ss_fma(auVar131,auVar44,
                                                               SUB6416(ZEXT464(0x40000000),0));
                                    fVar134 = (float)(int)((uVar24 >> 1) + local_39b8);
                                    fVar141 = auVar44._0_4_ * auVar43._0_4_;
                                    auVar132._0_4_ = fVar134 * auVar61._0_4_ + fVar142;
                                    auVar132._4_4_ = fVar134 * auVar61._4_4_ + fVar135;
                                    auVar132._8_4_ = fVar134 * auVar61._8_4_ + fVar146;
                                    auVar132._12_4_ = fVar134 * auVar61._12_4_ + fVar148;
                                    auVar125._4_4_ = fVar141;
                                    auVar125._0_4_ = fVar141;
                                    auVar125._8_4_ = fVar141;
                                    auVar125._12_4_ = fVar141;
                                    auVar43 = vmulps_avx512vl(auVar132,auVar125);
                                    bVar7 = (bool)(bVar29 >> 1 & 1);
                                    bVar9 = (bool)(bVar29 >> 2 & 1);
                                    auVar15._8_4_ = 0x219392ef;
                                    auVar15._0_8_ = 0x219392ef219392ef;
                                    auVar15._12_4_ = 0x219392ef;
                                    uVar28 = vcmpps_avx512vl(auVar48,auVar15,5);
                                    auVar44 = vrcp14ps_avx512vl(auVar61);
                                    auVar45 = vfnmadd213ps_avx512vl(auVar61,auVar44,auVar62);
                                    auVar44 = vfmadd132ps_avx512vl(auVar45,auVar44,auVar44);
                                    fVar147 = (float)((uint)((byte)uVar28 & 1) * auVar44._0_4_);
                                    fVar141 = (float)((uint)((byte)(uVar28 >> 1) & 1) *
                                                     auVar44._4_4_);
                                    fVar134 = (float)((uint)((byte)(uVar28 >> 2) & 1) *
                                                     auVar44._8_4_);
                                    fVar145 = (float)((uint)((byte)(uVar28 >> 3) & 1) *
                                                     auVar44._12_4_);
                                    auVar81._0_4_ =
                                         (float)((uint)(bVar29 & 1) * auVar47._0_4_ |
                                                (uint)!(bool)(bVar29 & 1) * (int)fVar74) * fVar147;
                                    auVar81._4_4_ =
                                         (float)((uint)bVar41 * auVar47._4_4_ |
                                                (uint)!bVar41 * (int)fVar83) * fVar141;
                                    auVar81._8_4_ =
                                         (float)((uint)bVar8 * auVar47._8_4_ |
                                                (uint)!bVar8 * (int)fVar84) * fVar134;
                                    auVar81._12_4_ =
                                         (float)((uint)(bVar29 >> 3) * auVar47._12_4_ |
                                                (uint)!(bool)(bVar29 >> 3) * (int)fVar85) * fVar145;
                                    local_38b0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                 vminps_avx512vl(auVar81,auVar62);
                                    auVar104._0_4_ =
                                         (float)((uint)(bVar29 & 1) * auVar43._0_4_ |
                                                (uint)!(bool)(bVar29 & 1) * (int)fVar142) * fVar147;
                                    auVar104._4_4_ =
                                         (float)((uint)bVar7 * auVar43._4_4_ |
                                                (uint)!bVar7 * (int)fVar135) * fVar141;
                                    auVar104._8_4_ =
                                         (float)((uint)bVar9 * auVar43._8_4_ |
                                                (uint)!bVar9 * (int)fVar146) * fVar134;
                                    auVar104._12_4_ =
                                         (float)((uint)(bVar29 >> 3) * auVar43._12_4_ |
                                                (uint)!(bool)(bVar29 >> 3) * (int)fVar148) * fVar145
                                    ;
                                    local_38c0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                 vminps_avx512vl(auVar104,auVar62);
                                    local_3900._16_16_ = auVar65;
                                    local_3900._0_16_ = auVar64;
                                    local_39a0.geometryUserPtr = local_3850;
                                    local_39a0.valid = (int *)local_36e0;
                                    local_39a0.context = (RTCRayQueryContext *)&local_3840;
                                    local_39a0.ray = (RTCRayN *)local_3800;
                                    local_38d0 = vVar119.field_0;
                                    std::
                                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                                    ::
                                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                                *)&local_39a0,
                                               (_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                *)local_3900);
                                    local_38a0 = vpbroadcastd_avx512vl();
                                    local_38b0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                 vpbroadcastd_avx512vl();
                                    local_3900._0_32_ = local_36e0[0];
                                    local_38d0 = local_3800._0_16_;
                                    local_38c0 = local_3840;
                                    vpcmpeqd_avx2(ZEXT1632(local_38a0),ZEXT1632(local_38a0));
                                    uStack_388c = context->user->instID[0];
                                    local_3890 = uStack_388c;
                                    uStack_3888 = uStack_388c;
                                    uStack_3884 = uStack_388c;
                                    uStack_3880 = context->user->instPrimID[0];
                                    uStack_387c = uStack_3880;
                                    uStack_3878 = uStack_3880;
                                    uStack_3874 = uStack_3880;
                                    local_3910 = *(undefined1 (*) [16])(ray + 0x80);
                                    auVar43 = vblendmps_avx512vl(local_3910,local_3850);
                                    bVar41 = (bool)(bVar36 >> 1 & 1);
                                    bVar7 = (bool)(bVar36 >> 2 & 1);
                                    *(uint *)(ray + 0x80) =
                                         (uint)(bVar36 & 1) * auVar43._0_4_ |
                                         !(bool)(bVar36 & 1) * uStack_3880;
                                    *(uint *)(ray + 0x84) =
                                         (uint)bVar41 * auVar43._4_4_ | !bVar41 * uStack_3880;
                                    *(uint *)(ray + 0x88) =
                                         (uint)bVar7 * auVar43._8_4_ | !bVar7 * uStack_3880;
                                    *(uint *)(ray + 0x8c) =
                                         (uint)(bVar36 >> 3) * auVar43._12_4_ |
                                         !(bool)(bVar36 >> 3) * uStack_3880;
                                    auVar43 = vpmovm2d_avx512vl(uVar33);
                                    local_3940._0_16_ = auVar43;
                                    local_39a0.geometryUserPtr =
                                         (void *)*(undefined8 *)(local_39b0._0_8_ + 0x18);
                                    local_39a0.valid = (int *)local_3940;
                                    local_39a0.context = context->user;
                                    local_39a0.ray = (RTCRayN *)ray;
                                    local_39a0.hit = (RTCHitN *)local_3900;
                                    local_39a0.N = 4;
                                    if (*(code **)(local_39b0._0_8_ + 0x48) != (code *)0x0) {
                                      (**(code **)(local_39b0._0_8_ + 0x48))(&local_39a0);
                                      auVar43 = local_3940._0_16_;
                                    }
                                    uVar33 = vptestmd_avx512vl(auVar43,auVar43);
                                    if ((uVar33 & 0xf) == 0) {
                                      uVar33 = 0;
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar150 = ZEXT1664(auVar43);
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar151 = ZEXT1664(auVar43);
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar152 = ZEXT1664(auVar43);
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                      auVar153 = ZEXT1664(auVar43);
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                      auVar154 = ZEXT1664(auVar43);
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                      auVar155 = ZEXT1664(auVar43);
                                    }
                                    else {
                                      p_Var6 = context->args->filter;
                                      if (p_Var6 == (RTCFilterFunctionN)0x0) {
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar150 = ZEXT1664(auVar47);
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                        auVar151 = ZEXT1664(auVar47);
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar152 = ZEXT1664(auVar47);
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                        auVar153 = ZEXT1664(auVar47);
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                        auVar154 = ZEXT1664(auVar47);
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                        auVar155 = ZEXT1664(auVar47);
                                      }
                                      else {
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar150 = ZEXT1664(auVar47);
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                        auVar151 = ZEXT1664(auVar47);
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar152 = ZEXT1664(auVar47);
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                        auVar153 = ZEXT1664(auVar47);
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                        auVar154 = ZEXT1664(auVar47);
                                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                        auVar155 = ZEXT1664(auVar47);
                                        if (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                           ((*(byte *)(local_39b0._0_8_ + 0x3e) & 0x40) != 0)) {
                                          (*p_Var6)(&local_39a0);
                                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                          auVar155 = ZEXT1664(auVar43);
                                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                          auVar154 = ZEXT1664(auVar43);
                                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                          auVar153 = ZEXT1664(auVar43);
                                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar152 = ZEXT1664(auVar43);
                                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                          auVar151 = ZEXT1664(auVar43);
                                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar150 = ZEXT1664(auVar43);
                                          auVar43 = local_3940._0_16_;
                                        }
                                      }
                                      uVar33 = vptestmd_avx512vl(auVar43,auVar43);
                                      uVar33 = uVar33 & 0xf;
                                      iVar23 = *(int *)(local_39a0.ray + 0x84);
                                      iVar18 = *(int *)(local_39a0.ray + 0x88);
                                      iVar19 = *(int *)(local_39a0.ray + 0x8c);
                                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      bVar41 = (bool)((byte)uVar33 & 1);
                                      bVar7 = (bool)((byte)(uVar33 >> 1) & 1);
                                      bVar8 = (bool)((byte)(uVar33 >> 2) & 1);
                                      bVar9 = SUB81(uVar33 >> 3,0);
                                      *(uint *)&local_39a0.ray[0x80].field_0x0 =
                                           (uint)bVar41 * auVar43._0_4_ |
                                           (uint)!bVar41 * *(int *)&local_39a0.ray[0x80].field_0x0;
                                      *(uint *)(local_39a0.ray + 0x84) =
                                           (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * iVar23;
                                      *(uint *)(local_39a0.ray + 0x88) =
                                           (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * iVar18;
                                      *(uint *)(local_39a0.ray + 0x8c) =
                                           (uint)bVar9 * auVar43._12_4_ | (uint)!bVar9 * iVar19;
                                    }
                                    bVar41 = (bool)((byte)uVar33 & 1);
                                    auVar72._0_4_ =
                                         (uint)bVar41 * *(int *)local_3968 |
                                         (uint)!bVar41 * local_3910._0_4_;
                                    bVar41 = (bool)((byte)(uVar33 >> 1) & 1);
                                    auVar72._4_4_ =
                                         (uint)bVar41 * *(int *)(local_3968 + 4) |
                                         (uint)!bVar41 * local_3910._4_4_;
                                    bVar41 = (bool)((byte)(uVar33 >> 2) & 1);
                                    auVar72._8_4_ =
                                         (uint)bVar41 * *(int *)(local_3968 + 8) |
                                         (uint)!bVar41 * local_3910._8_4_;
                                    bVar41 = SUB81(uVar33 >> 3,0);
                                    auVar72._12_4_ =
                                         (uint)bVar41 * *(int *)(local_3968 + 0xc) |
                                         (uint)!bVar41 * local_3910._12_4_;
                                    *(undefined1 (*) [16])local_3968 = auVar72;
                                  }
                                  bVar37 = ((byte)uVar33 ^ 0xf) & bVar30;
                                }
                                bVar30 = (bVar29 ^ 0xf) & bVar30;
                              }
                            }
                            if (bVar30 == 0) {
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar149 = ZEXT1664(auVar43);
                              bVar30 = bVar37;
                            }
                            else {
                              auVar43 = *(undefined1 (*) [16])ray;
                              auVar47 = *(undefined1 (*) [16])(ray + 0x10);
                              auVar44 = *(undefined1 (*) [16])(ray + 0x20);
                              auVar45 = *(undefined1 (*) [16])(ray + 0x40);
                              auVar46 = *(undefined1 (*) [16])(ray + 0x50);
                              auVar62 = *(undefined1 (*) [16])(ray + 0x60);
                              auVar75 = vsubps_avx(local_3660,auVar43);
                              auVar70 = vsubps_avx(local_3670,auVar47);
                              auVar71 = vsubps_avx(local_3680,auVar44);
                              auVar61 = vsubps_avx(local_3630,auVar43);
                              auVar58 = vsubps_avx(local_3640,auVar47);
                              auVar48 = vsubps_avx512vl(local_3650,auVar44);
                              auVar49 = vsubps_avx512vl(local_3860,auVar43);
                              auVar47 = vsubps_avx512vl(local_3610,auVar47);
                              auVar44 = vsubps_avx512vl(local_3620,auVar44);
                              auVar50 = vsubps_avx512vl(auVar49,auVar75);
                              auVar51 = vsubps_avx512vl(auVar47,auVar70);
                              auVar52 = vsubps_avx512vl(auVar44,auVar71);
                              auVar53 = vsubps_avx512vl(auVar75,auVar61);
                              auVar54 = vsubps_avx512vl(auVar70,auVar58);
                              auVar55 = vsubps_avx512vl(auVar71,auVar48);
                              auVar56 = vsubps_avx512vl(auVar61,auVar49);
                              auVar57 = vsubps_avx512vl(auVar58,auVar47);
                              auVar59 = vsubps_avx512vl(auVar48,auVar44);
                              auVar43 = vaddps_avx512vl(auVar49,auVar75);
                              auVar60 = vaddps_avx512vl(auVar47,auVar70);
                              auVar63 = vaddps_avx512vl(auVar44,auVar71);
                              auVar66 = vmulps_avx512vl(auVar60,auVar52);
                              auVar66 = vfmsub231ps_avx512vl(auVar66,auVar51,auVar63);
                              auVar63 = vmulps_avx512vl(auVar63,auVar50);
                              auVar63 = vfmsub231ps_avx512vl(auVar63,auVar52,auVar43);
                              auVar113._0_4_ = auVar51._0_4_ * auVar43._0_4_;
                              auVar113._4_4_ = auVar51._4_4_ * auVar43._4_4_;
                              auVar113._8_4_ = auVar51._8_4_ * auVar43._8_4_;
                              auVar113._12_4_ = auVar51._12_4_ * auVar43._12_4_;
                              auVar43 = vfmsub231ps_fma(auVar113,auVar50,auVar60);
                              fVar142 = auVar62._0_4_;
                              auVar114._0_4_ = fVar142 * auVar43._0_4_;
                              fVar135 = auVar62._4_4_;
                              auVar114._4_4_ = fVar135 * auVar43._4_4_;
                              fVar146 = auVar62._8_4_;
                              auVar114._8_4_ = fVar146 * auVar43._8_4_;
                              fVar148 = auVar62._12_4_;
                              auVar114._12_4_ = fVar148 * auVar43._12_4_;
                              auVar43 = vfmadd231ps_avx512vl(auVar114,auVar46,auVar63);
                              auVar60 = vfmadd231ps_avx512vl(auVar43,auVar45,auVar66);
                              auVar122._0_4_ = auVar75._0_4_ + auVar61._0_4_;
                              auVar122._4_4_ = auVar75._4_4_ + auVar61._4_4_;
                              auVar122._8_4_ = auVar75._8_4_ + auVar61._8_4_;
                              auVar122._12_4_ = auVar75._12_4_ + auVar61._12_4_;
                              auVar43 = vaddps_avx512vl(auVar70,auVar58);
                              auVar63 = vaddps_avx512vl(auVar71,auVar48);
                              auVar66 = vmulps_avx512vl(auVar43,auVar55);
                              auVar66 = vfmsub231ps_avx512vl(auVar66,auVar54,auVar63);
                              auVar63 = vmulps_avx512vl(auVar63,auVar53);
                              auVar63 = vfmsub231ps_avx512vl(auVar63,auVar55,auVar122);
                              auVar67 = vmulps_avx512vl(auVar122,auVar54);
                              auVar43 = vfmsub231ps_avx512vl(auVar67,auVar53,auVar43);
                              auVar123._0_4_ = auVar43._0_4_ * fVar142;
                              auVar123._4_4_ = auVar43._4_4_ * fVar135;
                              auVar123._8_4_ = auVar43._8_4_ * fVar146;
                              auVar123._12_4_ = auVar43._12_4_ * fVar148;
                              auVar43 = vfmadd231ps_avx512vl(auVar123,auVar46,auVar63);
                              auVar63 = vfmadd231ps_avx512vl(auVar43,auVar45,auVar66);
                              auVar43 = vaddps_avx512vl(auVar61,auVar49);
                              auVar47 = vaddps_avx512vl(auVar58,auVar47);
                              auVar44 = vaddps_avx512vl(auVar48,auVar44);
                              auVar61 = vmulps_avx512vl(auVar47,auVar59);
                              auVar61 = vfmsub231ps_avx512vl(auVar61,auVar57,auVar44);
                              auVar44 = vmulps_avx512vl(auVar44,auVar56);
                              auVar44 = vfmsub231ps_avx512vl(auVar44,auVar59,auVar43);
                              auVar102._0_4_ = auVar43._0_4_ * auVar57._0_4_;
                              auVar102._4_4_ = auVar43._4_4_ * auVar57._4_4_;
                              auVar102._8_4_ = auVar43._8_4_ * auVar57._8_4_;
                              auVar102._12_4_ = auVar43._12_4_ * auVar57._12_4_;
                              auVar43 = vfmsub231ps_fma(auVar102,auVar56,auVar47);
                              auVar43 = vmulps_avx512vl(auVar43,auVar62);
                              auVar43 = vfmadd231ps_avx512vl(auVar43,auVar46,auVar44);
                              auVar43 = vfmadd231ps_avx512vl(auVar43,auVar45,auVar61);
                              auVar103._0_4_ = auVar63._0_4_ + auVar60._0_4_;
                              auVar103._4_4_ = auVar63._4_4_ + auVar60._4_4_;
                              auVar103._8_4_ = auVar63._8_4_ + auVar60._8_4_;
                              auVar103._12_4_ = auVar63._12_4_ + auVar60._12_4_;
                              auVar47 = vaddps_avx512vl(auVar43,auVar103);
                              auVar49 = auVar150._0_16_;
                              auVar44 = vandps_avx512vl(auVar47,auVar49);
                              auVar62 = vmulps_avx512vl(auVar44,auVar155._0_16_);
                              auVar61 = vminps_avx512vl(auVar60,auVar63);
                              auVar61 = vminps_avx512vl(auVar61,auVar43);
                              auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar149 = ZEXT1664(auVar58);
                              auVar48 = vxorps_avx512vl(auVar62,auVar58);
                              uVar10 = vcmpps_avx512vl(auVar61,auVar48,5);
                              auVar61 = vmaxps_avx512vl(auVar60,auVar63);
                              auVar43 = vmaxps_avx512vl(auVar61,auVar43);
                              uVar11 = vcmpps_avx512vl(auVar43,auVar62,2);
                              bVar29 = ((byte)uVar10 | (byte)uVar11) & 0xf & bVar37;
                              bVar30 = bVar37;
                              if (bVar29 != 0) {
                                auVar43 = vmulps_avx512vl(auVar54,auVar52);
                                auVar62 = vmulps_avx512vl(auVar50,auVar55);
                                auVar61 = vmulps_avx512vl(auVar53,auVar51);
                                auVar48 = vmulps_avx512vl(auVar57,auVar55);
                                auVar66 = vmulps_avx512vl(auVar53,auVar59);
                                auVar67 = vmulps_avx512vl(auVar56,auVar54);
                                auVar51 = vfmsub213ps_avx512vl(auVar51,auVar55,auVar43);
                                auVar52 = vfmsub213ps_avx512vl(auVar52,auVar53,auVar62);
                                auVar50 = vfmsub213ps_avx512vl(auVar50,auVar54,auVar61);
                                auVar59 = vfmsub213ps_avx512vl(auVar59,auVar54,auVar48);
                                auVar55 = vfmsub213ps_avx512vl(auVar56,auVar55,auVar66);
                                auVar53 = vfmsub213ps_avx512vl(auVar57,auVar53,auVar67);
                                auVar43 = vandps_avx512vl(auVar43,auVar49);
                                auVar48 = vandps_avx512vl(auVar48,auVar49);
                                uVar33 = vcmpps_avx512vl(auVar43,auVar48,1);
                                auVar43 = vandps_avx512vl(auVar62,auVar49);
                                auVar62 = vandps_avx512vl(auVar66,auVar49);
                                uVar28 = vcmpps_avx512vl(auVar43,auVar62,1);
                                auVar43 = vandps_avx512vl(auVar61,auVar49);
                                auVar62 = vandps_avx512vl(auVar67,auVar49);
                                uVar25 = vcmpps_avx512vl(auVar43,auVar62,1);
                                bVar41 = (bool)((byte)uVar33 & 1);
                                auVar68._0_4_ =
                                     (uint)bVar41 * auVar51._0_4_ | (uint)!bVar41 * auVar59._0_4_;
                                bVar41 = (bool)((byte)(uVar33 >> 1) & 1);
                                auVar68._4_4_ =
                                     (uint)bVar41 * auVar51._4_4_ | (uint)!bVar41 * auVar59._4_4_;
                                bVar41 = (bool)((byte)(uVar33 >> 2) & 1);
                                auVar68._8_4_ =
                                     (uint)bVar41 * auVar51._8_4_ | (uint)!bVar41 * auVar59._8_4_;
                                bVar41 = (bool)((byte)(uVar33 >> 3) & 1);
                                auVar68._12_4_ =
                                     (uint)bVar41 * auVar51._12_4_ | (uint)!bVar41 * auVar59._12_4_;
                                bVar41 = (bool)((byte)uVar28 & 1);
                                auVar69._0_4_ =
                                     (uint)bVar41 * auVar52._0_4_ | (uint)!bVar41 * auVar55._0_4_;
                                bVar41 = (bool)((byte)(uVar28 >> 1) & 1);
                                auVar69._4_4_ =
                                     (uint)bVar41 * auVar52._4_4_ | (uint)!bVar41 * auVar55._4_4_;
                                bVar41 = (bool)((byte)(uVar28 >> 2) & 1);
                                auVar69._8_4_ =
                                     (uint)bVar41 * auVar52._8_4_ | (uint)!bVar41 * auVar55._8_4_;
                                bVar41 = (bool)((byte)(uVar28 >> 3) & 1);
                                auVar69._12_4_ =
                                     (uint)bVar41 * auVar52._12_4_ | (uint)!bVar41 * auVar55._12_4_;
                                bVar41 = (bool)((byte)uVar25 & 1);
                                local_3900._32_4_ =
                                     (float)((uint)bVar41 * auVar50._0_4_ |
                                            (uint)!bVar41 * auVar53._0_4_);
                                bVar41 = (bool)((byte)(uVar25 >> 1) & 1);
                                local_3900._36_4_ =
                                     (float)((uint)bVar41 * auVar50._4_4_ |
                                            (uint)!bVar41 * auVar53._4_4_);
                                bVar41 = (bool)((byte)(uVar25 >> 2) & 1);
                                local_3900._40_4_ =
                                     (float)((uint)bVar41 * auVar50._8_4_ |
                                            (uint)!bVar41 * auVar53._8_4_);
                                bVar41 = (bool)((byte)(uVar25 >> 3) & 1);
                                local_3900._44_4_ =
                                     (float)((uint)bVar41 * auVar50._12_4_ |
                                            (uint)!bVar41 * auVar53._12_4_);
                                auVar144._0_4_ = fVar142 * local_3900._32_4_;
                                auVar144._4_4_ = fVar135 * local_3900._36_4_;
                                auVar144._8_4_ = fVar146 * local_3900._40_4_;
                                auVar144._12_4_ = fVar148 * local_3900._44_4_;
                                auVar43 = vfmadd213ps_fma(auVar46,auVar69,auVar144);
                                auVar43 = vfmadd213ps_fma(auVar45,auVar68,auVar43);
                                auVar130._0_4_ = auVar43._0_4_ + auVar43._0_4_;
                                auVar130._4_4_ = auVar43._4_4_ + auVar43._4_4_;
                                auVar130._8_4_ = auVar43._8_4_ + auVar43._8_4_;
                                auVar130._12_4_ = auVar43._12_4_ + auVar43._12_4_;
                                auVar137._0_4_ = auVar71._0_4_ * local_3900._32_4_;
                                auVar137._4_4_ = auVar71._4_4_ * local_3900._36_4_;
                                auVar137._8_4_ = auVar71._8_4_ * local_3900._40_4_;
                                auVar137._12_4_ = auVar71._12_4_ * local_3900._44_4_;
                                auVar43 = vfmadd213ps_fma(auVar70,auVar69,auVar137);
                                auVar45 = vfmadd213ps_fma(auVar75,auVar68,auVar43);
                                auVar43 = vrcp14ps_avx512vl(auVar130);
                                auVar46 = vxorps_avx512vl(auVar130,auVar58);
                                auVar75 = auVar151._0_16_;
                                auVar62 = vfnmadd213ps_avx512vl(auVar43,auVar130,auVar75);
                                auVar43 = vfmadd132ps_fma(auVar62,auVar43,auVar43);
                                vVar116.field_0._0_4_ =
                                     auVar43._0_4_ * (auVar45._0_4_ + auVar45._0_4_);
                                vVar116.field_0._4_4_ =
                                     auVar43._4_4_ * (auVar45._4_4_ + auVar45._4_4_);
                                vVar116.field_0._8_4_ =
                                     auVar43._8_4_ * (auVar45._8_4_ + auVar45._8_4_);
                                vVar116.field_0._12_4_ =
                                     auVar43._12_4_ * (auVar45._12_4_ + auVar45._12_4_);
                                uVar10 = vcmpps_avx512vl((undefined1  [16])vVar116.field_0,
                                                         *(undefined1 (*) [16])(ray + 0x80),2);
                                uVar11 = vcmpps_avx512vl((undefined1  [16])vVar116.field_0,
                                                         *(undefined1 (*) [16])(ray + 0x30),0xd);
                                uVar12 = vcmpps_avx512vl(auVar130,auVar46,4);
                                bVar29 = bVar29 & (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
                                if (bVar29 != 0) {
                                  uVar33 = CONCAT44(0,*(uint *)((long)&local_37d0 + lVar27 * 4));
                                  local_39b0._0_8_ = uVar33;
                                  pGVar4 = (context->scene->geometries).items[uVar33].ptr;
                                  uVar1 = pGVar4->mask;
                                  auVar120._4_4_ = uVar1;
                                  auVar120._0_4_ = uVar1;
                                  auVar120._8_4_ = uVar1;
                                  auVar120._12_4_ = uVar1;
                                  uVar10 = vptestmd_avx512vl(auVar120,*(undefined1 (*) [16])
                                                                       (ray + 0x90));
                                  bVar36 = (byte)uVar10 & 0xf & bVar29;
                                  uVar33 = (ulong)bVar36;
                                  if (bVar36 != 0) {
                                    local_3860._0_4_ =
                                         *(undefined4 *)((long)&local_37e0 + lVar27 * 4);
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar43 = vsubps_avx(auVar47,auVar60);
                                      auVar45 = vsubps_avx(auVar47,auVar63);
                                      auVar46 = vcvtsi2ss_avx512f(auVar54,*(ushort *)
                                                                           (lVar5 + 8 + lVar26) - 1)
                                      ;
                                      auVar17._12_4_ = 0;
                                      auVar17._0_12_ = ZEXT812(0);
                                      auVar62 = vrcp14ss_avx512f(auVar17 << 0x20,
                                                                 ZEXT416(auVar46._0_4_));
                                      auVar46 = vfnmadd213ss_fma(auVar46,auVar62,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar142 = auVar62._0_4_ * auVar46._0_4_;
                                      auVar46 = vcvtsi2ss_avx512f(auVar54,*(ushort *)
                                                                           (lVar5 + 10 + lVar26) - 1
                                                                 );
                                      auVar62 = vcvtsi2ss_avx512f(auVar54,(uVar24 & 1) + local_39b4)
                                      ;
                                      fVar135 = auVar62._0_4_;
                                      auVar139._0_4_ = fVar135 * auVar47._0_4_ + auVar43._0_4_;
                                      auVar139._4_4_ = fVar135 * auVar47._4_4_ + auVar43._4_4_;
                                      auVar139._8_4_ = fVar135 * auVar47._8_4_ + auVar43._8_4_;
                                      auVar139._12_4_ = fVar135 * auVar47._12_4_ + auVar43._12_4_;
                                      auVar126._4_4_ = fVar142;
                                      auVar126._0_4_ = fVar142;
                                      auVar126._8_4_ = fVar142;
                                      auVar126._12_4_ = fVar142;
                                      auVar70 = vmulps_avx512vl(auVar139,auVar126);
                                      bVar41 = (bool)(bVar29 >> 1 & 1);
                                      bVar8 = (bool)(bVar29 >> 2 & 1);
                                      auVar71 = vrcp14ss_avx512f(auVar17 << 0x20,
                                                                 ZEXT416(auVar46._0_4_));
                                      auVar62 = vfnmadd213ss_fma(auVar46,auVar71,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      auVar46 = vcvtsi2ss_avx512f(auVar54,(uVar24 >> 1) + local_39b8
                                                                 );
                                      fVar142 = auVar71._0_4_ * auVar62._0_4_;
                                      fVar135 = auVar46._0_4_;
                                      auVar133._0_4_ = fVar135 * auVar47._0_4_ + auVar45._0_4_;
                                      auVar133._4_4_ = fVar135 * auVar47._4_4_ + auVar45._4_4_;
                                      auVar133._8_4_ = fVar135 * auVar47._8_4_ + auVar45._8_4_;
                                      auVar133._12_4_ = fVar135 * auVar47._12_4_ + auVar45._12_4_;
                                      auVar127._4_4_ = fVar142;
                                      auVar127._0_4_ = fVar142;
                                      auVar127._8_4_ = fVar142;
                                      auVar127._12_4_ = fVar142;
                                      auVar46 = vmulps_avx512vl(auVar133,auVar127);
                                      bVar7 = (bool)(bVar29 >> 1 & 1);
                                      bVar9 = (bool)(bVar29 >> 2 & 1);
                                      auVar14._8_4_ = 0x219392ef;
                                      auVar14._0_8_ = 0x219392ef219392ef;
                                      auVar14._12_4_ = 0x219392ef;
                                      uVar28 = vcmpps_avx512vl(auVar44,auVar14,5);
                                      auVar44 = vrcp14ps_avx512vl(auVar47);
                                      auVar47 = vfnmadd213ps_avx512vl(auVar47,auVar44,auVar75);
                                      auVar47 = vfmadd132ps_avx512vl(auVar47,auVar44,auVar44);
                                      fVar146 = (float)((uint)((byte)uVar28 & 1) * auVar47._0_4_);
                                      fVar142 = (float)((uint)((byte)(uVar28 >> 1) & 1) *
                                                       auVar47._4_4_);
                                      fVar135 = (float)((uint)((byte)(uVar28 >> 2) & 1) *
                                                       auVar47._8_4_);
                                      fVar148 = (float)((uint)((byte)(uVar28 >> 3) & 1) *
                                                       auVar47._12_4_);
                                      auVar108._0_4_ =
                                           (float)((uint)(bVar29 & 1) * auVar70._0_4_ |
                                                  (uint)!(bool)(bVar29 & 1) * (int)auVar43._0_4_) *
                                           fVar146;
                                      auVar108._4_4_ =
                                           (float)((uint)bVar41 * auVar70._4_4_ |
                                                  (uint)!bVar41 * (int)auVar43._4_4_) * fVar142;
                                      auVar108._8_4_ =
                                           (float)((uint)bVar8 * auVar70._8_4_ |
                                                  (uint)!bVar8 * (int)auVar43._8_4_) * fVar135;
                                      auVar108._12_4_ =
                                           (float)((uint)(bVar29 >> 3) * auVar70._12_4_ |
                                                  (uint)!(bool)(bVar29 >> 3) * (int)auVar43._12_4_)
                                           * fVar148;
                                      local_38b0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                   vminps_avx512vl(auVar108,auVar75);
                                      auVar105._0_4_ =
                                           (float)((uint)(bVar29 & 1) * auVar46._0_4_ |
                                                  (uint)!(bool)(bVar29 & 1) * (int)auVar45._0_4_) *
                                           fVar146;
                                      auVar105._4_4_ =
                                           (float)((uint)bVar7 * auVar46._4_4_ |
                                                  (uint)!bVar7 * (int)auVar45._4_4_) * fVar142;
                                      auVar105._8_4_ =
                                           (float)((uint)bVar9 * auVar46._8_4_ |
                                                  (uint)!bVar9 * (int)auVar45._8_4_) * fVar135;
                                      auVar105._12_4_ =
                                           (float)((uint)(bVar29 >> 3) * auVar46._12_4_ |
                                                  (uint)!(bool)(bVar29 >> 3) * (int)auVar45._12_4_)
                                           * fVar148;
                                      local_38c0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                   vminps_avx512vl(auVar105,auVar75);
                                      local_3900._16_16_ = auVar69;
                                      local_3900._0_16_ = auVar68;
                                      local_39a0.geometryUserPtr = local_3850;
                                      local_39a0.valid = (int *)local_36e0;
                                      local_39a0.context = (RTCRayQueryContext *)&local_3840;
                                      local_39a0.ray = (RTCRayN *)local_3800;
                                      local_38d0 = vVar116.field_0;
                                      std::
                                      _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                                      ::
                                      _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                                ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                                  *)&local_39a0,
                                                 (_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                  *)local_3900);
                                      local_38a0 = vpbroadcastd_avx512vl();
                                      local_38b0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                   vpbroadcastd_avx512vl();
                                      local_3900._0_32_ = local_36e0[0];
                                      local_38d0 = local_3800._0_16_;
                                      local_38c0 = local_3840;
                                      vpcmpeqd_avx2(ZEXT1632(local_38a0),ZEXT1632(local_38a0));
                                      uStack_388c = context->user->instID[0];
                                      local_3890 = uStack_388c;
                                      uStack_3888 = uStack_388c;
                                      uStack_3884 = uStack_388c;
                                      uStack_3880 = context->user->instPrimID[0];
                                      uStack_387c = uStack_3880;
                                      uStack_3878 = uStack_3880;
                                      uStack_3874 = uStack_3880;
                                      local_39b0 = *(undefined1 (*) [16])(ray + 0x80);
                                      auVar43 = vblendmps_avx512vl(local_39b0,local_3850);
                                      bVar41 = (bool)(bVar36 >> 1 & 1);
                                      bVar7 = (bool)(bVar36 >> 2 & 1);
                                      *(uint *)(ray + 0x80) =
                                           (uint)(bVar36 & 1) * auVar43._0_4_ |
                                           !(bool)(bVar36 & 1) * uStack_3880;
                                      *(uint *)(ray + 0x84) =
                                           (uint)bVar41 * auVar43._4_4_ | !bVar41 * uStack_3880;
                                      *(uint *)(ray + 0x88) =
                                           (uint)bVar7 * auVar43._8_4_ | !bVar7 * uStack_3880;
                                      *(uint *)(ray + 0x8c) =
                                           (uint)(bVar36 >> 3) * auVar43._12_4_ |
                                           !(bool)(bVar36 >> 3) * uStack_3880;
                                      auVar43 = vpmovm2d_avx512vl(uVar33);
                                      local_3940._0_16_ = auVar43;
                                      local_39a0.geometryUserPtr = pGVar4->userPtr;
                                      local_39a0.valid = (int *)local_3940;
                                      local_39a0.context = context->user;
                                      local_39a0.ray = (RTCRayN *)ray;
                                      local_39a0.hit = (RTCHitN *)local_3900;
                                      local_39a0.N = 4;
                                      if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        (*pGVar4->occlusionFilterN)(&local_39a0);
                                        auVar43 = local_3940._0_16_;
                                      }
                                      uVar33 = vptestmd_avx512vl(auVar43,auVar43);
                                      if ((uVar33 & 0xf) == 0) {
                                        uVar33 = 0;
                                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar150 = ZEXT1664(auVar43);
                                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                        auVar151 = ZEXT1664(auVar43);
                                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar152 = ZEXT1664(auVar43);
                                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                        auVar153 = ZEXT1664(auVar43);
                                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                        auVar154 = ZEXT1664(auVar43);
                                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                        auVar155 = ZEXT1664(auVar43);
                                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                        auVar149 = ZEXT1664(auVar43);
                                      }
                                      else {
                                        p_Var6 = context->args->filter;
                                        if (p_Var6 == (RTCFilterFunctionN)0x0) {
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar150 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                          auVar151 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar152 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                          auVar153 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                          auVar154 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                          auVar155 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar149 = ZEXT1664(auVar47);
                                        }
                                        else {
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar150 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                          auVar151 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar152 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                          auVar153 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                          auVar154 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                          auVar155 = ZEXT1664(auVar47);
                                          auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar149 = ZEXT1664(auVar47);
                                          if (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                             (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                                            (*p_Var6)(&local_39a0);
                                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar149 = ZEXT1664(auVar43);
                                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                            auVar155 = ZEXT1664(auVar43);
                                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                            auVar154 = ZEXT1664(auVar43);
                                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                            auVar153 = ZEXT1664(auVar43);
                                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar152 = ZEXT1664(auVar43);
                                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                            auVar151 = ZEXT1664(auVar43);
                                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                            auVar150 = ZEXT1664(auVar43);
                                            auVar43 = local_3940._0_16_;
                                          }
                                        }
                                        uVar33 = vptestmd_avx512vl(auVar43,auVar43);
                                        uVar33 = uVar33 & 0xf;
                                        iVar23 = *(int *)(local_39a0.ray + 0x84);
                                        iVar18 = *(int *)(local_39a0.ray + 0x88);
                                        iVar19 = *(int *)(local_39a0.ray + 0x8c);
                                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        bVar41 = (bool)((byte)uVar33 & 1);
                                        bVar7 = (bool)((byte)(uVar33 >> 1) & 1);
                                        bVar8 = (bool)((byte)(uVar33 >> 2) & 1);
                                        bVar9 = SUB81(uVar33 >> 3,0);
                                        *(uint *)&local_39a0.ray[0x80].field_0x0 =
                                             (uint)bVar41 * auVar43._0_4_ |
                                             (uint)!bVar41 * *(int *)&local_39a0.ray[0x80].field_0x0
                                        ;
                                        *(uint *)(local_39a0.ray + 0x84) =
                                             (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * iVar23;
                                        *(uint *)(local_39a0.ray + 0x88) =
                                             (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * iVar18;
                                        *(uint *)(local_39a0.ray + 0x8c) =
                                             (uint)bVar9 * auVar43._12_4_ | (uint)!bVar9 * iVar19;
                                      }
                                      bVar41 = (bool)((byte)uVar33 & 1);
                                      auVar73._0_4_ =
                                           (uint)bVar41 * *(int *)local_3968 |
                                           (uint)!bVar41 * local_39b0._0_4_;
                                      bVar41 = (bool)((byte)(uVar33 >> 1) & 1);
                                      auVar73._4_4_ =
                                           (uint)bVar41 * *(int *)(local_3968 + 4) |
                                           (uint)!bVar41 * local_39b0._4_4_;
                                      bVar41 = (bool)((byte)(uVar33 >> 2) & 1);
                                      auVar73._8_4_ =
                                           (uint)bVar41 * *(int *)(local_3968 + 8) |
                                           (uint)!bVar41 * local_39b0._8_4_;
                                      bVar41 = SUB81(uVar33 >> 3,0);
                                      auVar73._12_4_ =
                                           (uint)bVar41 * *(int *)(local_3968 + 0xc) |
                                           (uint)!bVar41 * local_39b0._12_4_;
                                      *(undefined1 (*) [16])local_3968 = auVar73;
                                    }
                                    bVar30 = ((byte)uVar33 ^ 0xf) & bVar37;
                                  }
                                }
                              }
                            }
                            lVar27 = lVar27 + 1;
                            puVar39 = puVar39 + 0x10;
                          } while (bVar30 != 0);
                          bVar30 = 0;
LAB_01d8abf0:
                          bVar35 = bVar35 & bVar30;
                          bVar41 = bVar35 == 0;
                          uVar28 = local_3948;
                          lVar27 = local_3808;
                          puVar32 = local_3950;
                          uVar33 = local_3960;
                        }
                      } while ((!bVar41) && (uVar28 = uVar28 - 1 & uVar28, uVar28 != 0));
                    }
                    lVar27 = local_3810 + 1;
                  }
                  bVar35 = (byte)local_39ec | ~bVar35 & 0xf;
                  local_39ec = (uint)bVar35;
                  if (bVar35 == 0xf) {
                    local_39ec._0_1_ = 0xf;
                    goto LAB_01d8ad95;
                  }
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar41 = (bool)(bVar35 >> 1 & 1);
                  bVar7 = (bool)(bVar35 >> 2 & 1);
                  bVar8 = (bool)(bVar35 >> 3 & 1);
                  local_36f0._4_4_ = (uint)bVar41 * auVar43._4_4_ | (uint)!bVar41 * local_36f0._4_4_
                  ;
                  local_36f0._0_4_ =
                       (uint)(bVar35 & 1) * auVar43._0_4_ |
                       (uint)!(bool)(bVar35 & 1) * local_36f0._0_4_;
                  local_36f0._8_4_ = (uint)bVar7 * auVar43._8_4_ | (uint)!bVar7 * local_36f0._8_4_;
                  local_36f0._12_4_ =
                       (uint)bVar8 * auVar43._12_4_ | (uint)!bVar8 * local_36f0._12_4_;
                }
                goto LAB_01d894ae;
              }
              auVar43 = auVar152._0_16_;
              for (lVar27 = 0;
                  (auVar140 = ZEXT1664(auVar43), lVar27 != 8 &&
                  (uVar28 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar27 * 8), uVar28 != 8));
                  lVar27 = lVar27 + 1) {
                uVar38 = *(undefined4 *)(root.ptr + 0x40 + lVar27 * 4);
                auVar75._4_4_ = uVar38;
                auVar75._0_4_ = uVar38;
                auVar75._8_4_ = uVar38;
                auVar75._12_4_ = uVar38;
                auVar44._8_8_ = local_37c0._8_8_;
                auVar44._0_8_ = local_37c0._0_8_;
                auVar45._8_8_ = local_37c0._24_8_;
                auVar45._0_8_ = local_37c0._16_8_;
                auVar46._8_8_ = local_37c0._40_8_;
                auVar46._0_8_ = local_37c0._32_8_;
                auVar47 = vsubps_avx(auVar75,auVar44);
                auVar52._0_4_ = (float)local_3760._0_4_ * auVar47._0_4_;
                auVar52._4_4_ = (float)local_3760._4_4_ * auVar47._4_4_;
                auVar52._8_4_ = fStack_3758 * auVar47._8_4_;
                auVar52._12_4_ = fStack_3754 * auVar47._12_4_;
                uVar38 = *(undefined4 *)(root.ptr + 0x80 + lVar27 * 4);
                auVar70._4_4_ = uVar38;
                auVar70._0_4_ = uVar38;
                auVar70._8_4_ = uVar38;
                auVar70._12_4_ = uVar38;
                auVar47 = vsubps_avx(auVar70,auVar45);
                auVar53._0_4_ = local_3750._0_4_ * auVar47._0_4_;
                auVar53._4_4_ = local_3750._4_4_ * auVar47._4_4_;
                auVar53._8_4_ = local_3750._8_4_ * auVar47._8_4_;
                auVar53._12_4_ = local_3750._12_4_ * auVar47._12_4_;
                uVar38 = *(undefined4 *)(root.ptr + 0xc0 + lVar27 * 4);
                auVar71._4_4_ = uVar38;
                auVar71._0_4_ = uVar38;
                auVar71._8_4_ = uVar38;
                auVar71._12_4_ = uVar38;
                auVar47 = vsubps_avx(auVar71,auVar46);
                auVar54._0_4_ = local_3740._0_4_ * auVar47._0_4_;
                auVar54._4_4_ = local_3740._4_4_ * auVar47._4_4_;
                auVar54._8_4_ = local_3740._8_4_ * auVar47._8_4_;
                auVar54._12_4_ = local_3740._12_4_ * auVar47._12_4_;
                uVar38 = *(undefined4 *)(root.ptr + 0x60 + lVar27 * 4);
                auVar61._4_4_ = uVar38;
                auVar61._0_4_ = uVar38;
                auVar61._8_4_ = uVar38;
                auVar61._12_4_ = uVar38;
                auVar47 = vsubps_avx(auVar61,auVar44);
                auVar49._0_4_ = (float)local_3760._0_4_ * auVar47._0_4_;
                auVar49._4_4_ = (float)local_3760._4_4_ * auVar47._4_4_;
                auVar49._8_4_ = fStack_3758 * auVar47._8_4_;
                auVar49._12_4_ = fStack_3754 * auVar47._12_4_;
                uVar38 = *(undefined4 *)(root.ptr + 0xa0 + lVar27 * 4);
                auVar58._4_4_ = uVar38;
                auVar58._0_4_ = uVar38;
                auVar58._8_4_ = uVar38;
                auVar58._12_4_ = uVar38;
                auVar47 = vsubps_avx(auVar58,auVar45);
                auVar50._0_4_ = local_3750._0_4_ * auVar47._0_4_;
                auVar50._4_4_ = local_3750._4_4_ * auVar47._4_4_;
                auVar50._8_4_ = local_3750._8_4_ * auVar47._8_4_;
                auVar50._12_4_ = local_3750._12_4_ * auVar47._12_4_;
                uVar38 = *(undefined4 *)(root.ptr + 0xe0 + lVar27 * 4);
                auVar48._4_4_ = uVar38;
                auVar48._0_4_ = uVar38;
                auVar48._8_4_ = uVar38;
                auVar48._12_4_ = uVar38;
                auVar47 = vsubps_avx(auVar48,auVar46);
                auVar51._0_4_ = local_3740._0_4_ * auVar47._0_4_;
                auVar51._4_4_ = local_3740._4_4_ * auVar47._4_4_;
                auVar51._8_4_ = local_3740._8_4_ * auVar47._8_4_;
                auVar51._12_4_ = local_3740._12_4_ * auVar47._12_4_;
                auVar47 = vminps_avx(auVar52,auVar49);
                auVar44 = vminps_avx(auVar53,auVar50);
                auVar47 = vmaxps_avx(auVar47,auVar44);
                auVar44 = vminps_avx(auVar54,auVar51);
                auVar47 = vmaxps_avx(auVar47,auVar44);
                auVar45 = vmulps_avx512vl(auVar47,auVar153._0_16_);
                auVar47 = vmaxps_avx(auVar52,auVar49);
                auVar44 = vmaxps_avx(auVar53,auVar50);
                auVar44 = vminps_avx(auVar47,auVar44);
                auVar47 = vmaxps_avx(auVar54,auVar51);
                auVar47 = vminps_avx(auVar44,auVar47);
                auVar44 = vmulps_avx512vl(auVar47,auVar154._0_16_);
                auVar47 = vmaxps_avx(auVar45,local_3700);
                auVar44 = vminps_avx(auVar44,local_36f0);
                uVar25 = vcmpps_avx512vl(auVar47,auVar44,2);
                uVar22 = uVar42;
                auVar47 = auVar43;
                if ((byte)uVar25 != 0) {
                  auVar44 = vblendmps_avx512vl(auVar152._0_16_,auVar45);
                  bVar41 = (bool)((byte)uVar25 & 1);
                  auVar47._0_4_ = (uint)bVar41 * auVar44._0_4_ | (uint)!bVar41 * auVar45._0_4_;
                  bVar41 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar47._4_4_ = (uint)bVar41 * auVar44._4_4_ | (uint)!bVar41 * auVar45._4_4_;
                  bVar41 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar47._8_4_ = (uint)bVar41 * auVar44._8_4_ | (uint)!bVar41 * auVar45._8_4_;
                  bVar41 = (bool)((byte)(uVar25 >> 3) & 1);
                  auVar47._12_4_ = (uint)bVar41 * auVar44._12_4_ | (uint)!bVar41 * auVar45._12_4_;
                  uVar22 = uVar28;
                  if (uVar42 != 8) {
                    *puVar32 = uVar42;
                    puVar32 = puVar32 + 1;
                    *pauVar40 = auVar43;
                    pauVar40 = pauVar40 + 1;
                  }
                }
                auVar43 = auVar47;
                uVar42 = uVar22;
              }
              if (uVar42 == 8) goto LAB_01d89680;
              uVar10 = vcmpps_avx512vl(auVar43,local_36f0,9);
              root.ptr = uVar42;
            } while ((byte)uVar33 < (byte)POPCOUNT((int)uVar10));
            *puVar32 = uVar42;
            puVar32 = puVar32 + 1;
            *pauVar40 = auVar43;
            pauVar40 = pauVar40 + 1;
LAB_01d89680:
            iVar23 = 4;
          }
          else {
            while (local_39b0 = auVar43, uVar42 != 0) {
              k = 0;
              for (uVar33 = uVar42; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              uVar42 = uVar42 - 1 & uVar42;
              bVar41 = occluded1(local_3820,local_3828,root,k,&local_39b9,ray,
                                 (TravRayK<4,_true> *)&local_37c0.field_0,context);
              bVar35 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar41) {
                bVar35 = 0;
              }
              local_39ec = (uint)((byte)local_39ec | bVar35);
              uVar33 = local_3960;
              auVar43 = local_39b0;
            }
            iVar23 = 3;
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar150 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar151 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar152 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar153 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar154 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar155 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar149 = ZEXT1664(auVar43);
            auVar140 = ZEXT1664(local_39b0);
            if ((byte)local_39ec != 0xf) {
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_36f0._0_4_ =
                   (uint)((byte)local_39ec & 1) * auVar43._0_4_ |
                   (uint)!(bool)((byte)local_39ec & 1) * local_36f0._0_4_;
              bVar41 = (bool)((byte)(local_39ec >> 1) & 1);
              local_36f0._4_4_ = (uint)bVar41 * auVar43._4_4_ | (uint)!bVar41 * local_36f0._4_4_;
              bVar41 = (bool)((byte)(local_39ec >> 2) & 1);
              local_36f0._8_4_ = (uint)bVar41 * auVar43._8_4_ | (uint)!bVar41 * local_36f0._8_4_;
              bVar41 = (bool)((byte)(local_39ec >> 3) & 1);
              local_36f0._12_4_ = (uint)bVar41 * auVar43._12_4_ | (uint)!bVar41 * local_36f0._12_4_;
              iVar23 = 2;
            }
            if (uVar33 < (uint)POPCOUNT(uVar38)) goto LAB_01d894f6;
          }
          if (iVar23 == 3) {
LAB_01d8ad95:
            local_39ec._0_1_ = (byte)local_39ec & (byte)local_3958;
            bVar41 = (bool)((byte)local_39ec >> 1 & 1);
            bVar7 = (bool)((byte)local_39ec >> 2 & 1);
            bVar8 = (bool)((byte)local_39ec >> 3 & 1);
            *(uint *)local_3968 =
                 (uint)((byte)local_39ec & 1) * -0x800000 |
                 (uint)!(bool)((byte)local_39ec & 1) * *(int *)local_3968;
            *(uint *)(local_3968 + 4) =
                 (uint)bVar41 * -0x800000 | (uint)!bVar41 * *(int *)(local_3968 + 4);
            *(uint *)(local_3968 + 8) =
                 (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_3968 + 8);
            *(uint *)(local_3968 + 0xc) =
                 (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_3968 + 0xc);
            return;
          }
        } while( true );
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }